

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::analyze_parameter_preservation
          (Compiler *this,SPIRFunction *entry,CFG *cfg,
          unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *variable_to_blocks,
          unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *complete_write_blocks)

{
  int *piVar1;
  size_t sVar2;
  Parameter *pPVar3;
  bool bVar4;
  SPIRType *pSVar5;
  const_iterator cVar6;
  long lVar7;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  visit_cache;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  sVar2 = (entry->arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.
          buffer_size;
  if (sVar2 != 0) {
    pPVar3 = (entry->arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar7 = 0;
    do {
      pSVar5 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)((long)&(pPVar3->type).id + lVar7));
      if ((pSVar5->pointer == true) &&
         ((Sampler < pSVar5->basetype ||
          ((0x70800U >> (pSVar5->basetype & (MeshGridProperties|Int)) & 1) == 0)))) {
        local_68._M_buckets =
             (__buckets_ptr)
             CONCAT44(local_68._M_buckets._4_4_,*(undefined4 *)((long)&(pPVar3->id).id + lVar7));
        cVar6 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&variable_to_blocks->_M_h,(key_type_conflict *)&local_68);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          local_68._M_buckets =
               (__buckets_ptr)
               CONCAT44(local_68._M_buckets._4_4_,*(undefined4 *)((long)&(pPVar3->id).id + lVar7));
          cVar6 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&complete_write_blocks->_M_h,(key_type_conflict *)&local_68);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            piVar1 = (int *)((long)&pPVar3->read_count + lVar7);
            *piVar1 = *piVar1 + 1;
          }
          else {
            local_68._M_buckets = &local_68._M_single_bucket;
            local_68._M_bucket_count = 1;
            local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_68._M_element_count = 0;
            local_68._M_rehash_policy._M_max_load_factor = 1.0;
            local_68._M_rehash_policy._M_next_resize = 0;
            local_68._M_single_bucket = (__node_base_ptr)0x0;
            bVar4 = exists_unaccessed_path_to_return
                              (cfg,(entry->entry_block).id,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)((long)cVar6.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                         ._M_cur + 0x10),
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&local_68);
            if (bVar4) {
              piVar1 = (int *)((long)&pPVar3->read_count + lVar7);
              *piVar1 = *piVar1 + 1;
            }
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_68);
          }
        }
      }
      lVar7 = lVar7 + 0x14;
    } while (sVar2 * 0x14 != lVar7);
  }
  return;
}

Assistant:

void Compiler::analyze_parameter_preservation(
    SPIRFunction &entry, const CFG &cfg, const unordered_map<uint32_t, unordered_set<uint32_t>> &variable_to_blocks,
    const unordered_map<uint32_t, unordered_set<uint32_t>> &complete_write_blocks)
{
	for (auto &arg : entry.arguments)
	{
		// Non-pointers are always inputs.
		auto &type = get<SPIRType>(arg.type);
		if (!type.pointer)
			continue;

		// Opaque argument types are always in
		bool potential_preserve;
		switch (type.basetype)
		{
		case SPIRType::Sampler:
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::AtomicCounter:
			potential_preserve = false;
			break;

		default:
			potential_preserve = true;
			break;
		}

		if (!potential_preserve)
			continue;

		auto itr = variable_to_blocks.find(arg.id);
		if (itr == end(variable_to_blocks))
		{
			// Variable is never accessed.
			continue;
		}

		// We have accessed a variable, but there was no complete writes to that variable.
		// We deduce that we must preserve the argument.
		itr = complete_write_blocks.find(arg.id);
		if (itr == end(complete_write_blocks))
		{
			arg.read_count++;
			continue;
		}

		// If there is a path through the CFG where no block completely writes to the variable, the variable will be in an undefined state
		// when the function returns. We therefore need to implicitly preserve the variable in case there are writers in the function.
		// Major case here is if a function is
		// void foo(int &var) { if (cond) var = 10; }
		// Using read/write counts, we will think it's just an out variable, but it really needs to be inout,
		// because if we don't write anything whatever we put into the function must return back to the caller.
		unordered_set<uint32_t> visit_cache;
		if (exists_unaccessed_path_to_return(cfg, entry.entry_block, itr->second, visit_cache))
			arg.read_count++;
	}
}